

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

int nuraft::buffer::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  element_type *this;
  byte *__dest;
  byte *__src;
  size_t __n;
  byte *src;
  byte *dst;
  ptr<buffer> *other;
  size_t in_stack_000000d8;
  byte *p;
  
  size((buffer *)__child_stack);
  alloc(in_stack_000000d8);
  this = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )0x2b24f1);
  __dest = data_begin(this);
  __src = data_begin((buffer *)__child_stack);
  p = __src;
  __n = size((buffer *)__child_stack);
  memcpy(__dest,__src,__n);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b2568);
  pos((buffer *)__fn,(size_t)p);
  return (int)__fn;
}

Assistant:

ptr<buffer> buffer::clone(const buffer& buf) {
    ptr<buffer> other = alloc(buf.size());

    byte* dst = other->data_begin();
    byte* src = buf.data_begin();
    ::memcpy(dst, src, buf.size());

    other->pos(0);
    return other;
}